

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::normalize_space(char_t *buffer)

{
  byte bVar1;
  char_t *pcVar2;
  char_t ch;
  char_t *it;
  char_t *write;
  char_t *buffer_local;
  
  it = buffer;
  write = buffer;
  while (*it != '\0') {
    pcVar2 = it + 1;
    bVar1 = *it;
    it = pcVar2;
    if (((anonymous_namespace)::chartype_table[bVar1] & 8) == 0) {
      *write = bVar1;
      write = write + 1;
    }
    else {
      while (((anonymous_namespace)::chartype_table[(byte)*it] & 8) != 0) {
        it = it + 1;
      }
      if (write != buffer) {
        *write = ' ';
        write = write + 1;
      }
    }
  }
  if ((write != buffer) && (((anonymous_namespace)::chartype_table[(byte)write[-1]] & 8) != 0)) {
    write = write + -1;
  }
  *write = '\0';
  return write;
}

Assistant:

PUGI_IMPL_FN char_t* normalize_space(char_t* buffer)
	{
		char_t* write = buffer;

		for (char_t* it = buffer; *it; )
		{
			char_t ch = *it++;

			if (PUGI_IMPL_IS_CHARTYPE(ch, ct_space))
			{
				// replace whitespace sequence with single space
				while (PUGI_IMPL_IS_CHARTYPE(*it, ct_space)) it++;

				// avoid leading spaces
				if (write != buffer) *write++ = ' ';
			}
			else *write++ = ch;
		}

		// remove trailing space
		if (write != buffer && PUGI_IMPL_IS_CHARTYPE(write[-1], ct_space)) write--;

		// zero-terminate
		*write = 0;

		return write;
	}